

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall Database::Close(Database *this)

{
  anon_union_8_2_1ccce1b9_for_impl__0 *paVar1;
  Database *this_local;
  
  if ((this->connected & 1U) != 0) {
    this->connected = false;
    if (this->engine == MySQL) {
      paVar1 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      mysql_close(paVar1->mysql_handle);
    }
    else if (this->engine == SQLite) {
      paVar1 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                          (&this->impl)->field_0;
      sqlite3_close(paVar1->mysql_handle);
    }
  }
  return;
}

Assistant:

void Database::Close()
{
	if (!this->connected)
	{
		return;
	}

	this->connected = false;

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			mysql_close(this->impl->mysql_handle);
			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			sqlite3_close(this->impl->sqlite_handle);
			break;
#endif // DATABASE_SQLITE
	}
}